

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_hashmap_intersect(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap_node *pNode;
  int iVar1;
  jx9_value *pValue;
  jx9_value *pNeedle;
  int in_ECX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  ulong uVar3;
  jx9_hashmap_node **ppjVar4;
  int iVar5;
  bool bVar6;
  
  if (0 < nArg) {
    pValue = *apArg;
    if ((pValue->iFlags & 0x40) != 0) {
      if (nArg != 1) {
        pValue = jx9_context_new_array(pCtx);
        if (pValue == (jx9_value *)0x0) goto LAB_00131a7f;
        iVar5 = *(int *)(((*apArg)->x).iVal + 0x2c);
        ppjVar4 = (jx9_hashmap_node **)(((*apArg)->x).iVal + 0x10);
        while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
          pNode = *ppjVar4;
          pNeedle = HashmapExtractNodeValue(pNode);
          if (pNeedle != (jx9_value *)0x0) {
            uVar2 = extraout_RDX;
            for (uVar3 = 1; (uint)nArg != uVar3; uVar3 = uVar3 + 1) {
              if (((apArg[uVar3]->iFlags & 0x40) != 0) &&
                 (iVar1 = HashmapFindValue((jx9_hashmap *)(apArg[uVar3]->x).pOther,pNeedle,
                                           (jx9_hashmap_node **)0x1,in_ECX), uVar2 = extraout_RDX_00
                 , iVar1 != 0)) goto LAB_00131b14;
            }
            HashmapInsertNode((jx9_hashmap *)(pValue->x).pOther,pNode,(int)uVar2);
          }
LAB_00131b14:
          ppjVar4 = &pNode->pPrev;
        }
      }
      jx9_result_value(pCtx,pValue);
      return 0;
    }
  }
LAB_00131a7f:
  jx9_result_null(pCtx);
  return 0;
}

Assistant:

static int jx9_hashmap_intersect(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap_node *pEntry;
	jx9_hashmap *pSrc, *pMap;
	jx9_value *pArray;
	jx9_value *pVal;
	sxi32 rc;
	sxu32 n;
	int i;
	if( nArg < 1 || !jx9_value_is_json_array(apArg[0]) ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( nArg == 1 ){
		/* Return the first array since we cannot perform a diff */
		jx9_result_value(pCtx, apArg[0]);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the source hashmap */
	pSrc = (jx9_hashmap *)apArg[0]->x.pOther;
	/* Perform the intersection */
	pEntry = pSrc->pFirst;
	n = pSrc->nEntry;
	for(;;){
		if( n < 1 ){
			break;
		}
		/* Extract the node value */
		pVal = HashmapExtractNodeValue(pEntry);
		if( pVal ){
			for( i = 1 ; i < nArg ; i++ ){
				if( !jx9_value_is_json_array(apArg[i])) {
					/* ignore */
					continue;
				}
				/* Point to the internal representation of the hashmap */
				pMap = (jx9_hashmap *)apArg[i]->x.pOther;
				/* Perform the lookup */
				rc = HashmapFindValue(pMap, pVal, 0, TRUE);
				if( rc != SXRET_OK ){
					/* Value does not exist */
					break;
				}
			}
			if( i >= nArg ){
				/* Perform the insertion */
				HashmapInsertNode((jx9_hashmap *)pArray->x.pOther, pEntry, TRUE);
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
		n--;
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}